

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_av1.c
# Opt level: O2

uint masked_sad(uint8_t *src,int src_stride,uint8_t *a,int a_stride,uint8_t *b,int b_stride,
               uint8_t *m,int m_stride,int width,int height)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = 0;
  uVar5 = (ulong)(uint)width;
  if (width < 1) {
    uVar5 = uVar6;
  }
  if (height < 1) {
    height = 0;
  }
  uVar1 = 0;
  for (; (int)uVar6 != height; uVar6 = (ulong)((int)uVar6 + 1)) {
    for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      iVar4 = ((int)(((uint)b[uVar3] * (0x40 - (uint)m[uVar3]) + (uint)a[uVar3] * (uint)m[uVar3]) *
                     0x400 + 0x8000) >> 0x10) - (uint)src[uVar3];
      iVar2 = -iVar4;
      if (0 < iVar4) {
        iVar2 = iVar4;
      }
      uVar1 = uVar1 + iVar2;
    }
    src = src + src_stride;
    a = a + a_stride;
    b = b + b_stride;
    m = m + m_stride;
  }
  return uVar1;
}

Assistant:

static inline unsigned int masked_sad(const uint8_t *src, int src_stride,
                                      const uint8_t *a, int a_stride,
                                      const uint8_t *b, int b_stride,
                                      const uint8_t *m, int m_stride, int width,
                                      int height) {
  int y, x;
  unsigned int sad = 0;
  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x++) {
      const int16_t pred = AOM_BLEND_A64(m[x], a[x], b[x]);
      sad += abs(pred - src[x]);
    }
    src += src_stride;
    a += a_stride;
    b += b_stride;
    m += m_stride;
  }
  return sad;
}